

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FxchMan.c
# Opt level: O1

void Fxch_ManPrintStats(Fxch_Man_t *pFxchMan)

{
  int iVar1;
  long lVar2;
  long lVar3;
  uint uVar4;
  ulong uVar5;
  
  lVar2 = (long)pFxchMan->vCubes->nSize;
  uVar4 = 0;
  uVar5 = 0;
  if (0 < lVar2) {
    lVar3 = 0;
    uVar5 = 0;
    do {
      uVar5 = (ulong)((int)uVar5 +
                     (uint)(0 < *(int *)((long)&pFxchMan->vCubes->pArray->nSize + lVar3)));
      lVar3 = lVar3 + 0x10;
    } while (lVar2 * 0x10 != lVar3);
  }
  printf("Cubes =%8d  ",uVar5);
  lVar2 = (long)pFxchMan->vLits->nSize;
  if (0 < lVar2) {
    lVar3 = 0;
    uVar4 = 0;
    do {
      uVar4 = uVar4 + (0 < *(int *)((long)&pFxchMan->vLits->pArray->nSize + lVar3));
      lVar3 = lVar3 + 0x10;
    } while (lVar2 * 0x10 != lVar3);
  }
  printf("Lits  =%8d  ",(ulong)uVar4);
  printf("Divs  =%8d  ",(ulong)(uint)pFxchMan->pDivHash->vMap->nSize);
  iVar1 = pFxchMan->vDivPrio->nSize;
  if (0 < iVar1) {
    printf("Divs+ =%8d  ",(ulong)(iVar1 - 1));
    printf("Extr  =%7d  \n",(ulong)(uint)pFxchMan->nExtDivs);
    return;
  }
  __assert_fail("p->nSize > 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecQue.h"
                ,0x88,"int Vec_QueSize(Vec_Que_t *)");
}

Assistant:

void Fxch_ManPrintStats( Fxch_Man_t* pFxchMan )
{
    printf( "Cubes =%8d  ", Vec_WecSizeUsed( pFxchMan->vCubes ) );
    printf( "Lits  =%8d  ", Vec_WecSizeUsed( pFxchMan->vLits ) );
    printf( "Divs  =%8d  ", Hsh_VecSize( pFxchMan->pDivHash ) );
    printf( "Divs+ =%8d  ", Vec_QueSize( pFxchMan->vDivPrio ) );
    printf( "Extr  =%7d  \n", pFxchMan->nExtDivs );
}